

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenIndex
BinaryenCallIndirectAppendOperand(BinaryenExpressionRef expr,BinaryenExpressionRef operandExpr)

{
  BinaryenIndex BVar1;
  
  if (expr->_id != CallIndirectId) {
    __assert_fail("expression->is<CallIndirect>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x929,
                  "BinaryenIndex BinaryenCallIndirectAppendOperand(BinaryenExpressionRef, BinaryenExpressionRef)"
                 );
  }
  if (operandExpr != (BinaryenExpressionRef)0x0) {
    BVar1 = *(BinaryenIndex *)(expr + 2);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)&expr[1].type
               ,operandExpr);
    return BVar1;
  }
  __assert_fail("operandExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x92a,
                "BinaryenIndex BinaryenCallIndirectAppendOperand(BinaryenExpressionRef, BinaryenExpressionRef)"
               );
}

Assistant:

BinaryenIndex
BinaryenCallIndirectAppendOperand(BinaryenExpressionRef expr,
                                  BinaryenExpressionRef operandExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<CallIndirect>());
  assert(operandExpr);
  auto& list = static_cast<CallIndirect*>(expression)->operands;
  auto index = list.size();
  list.push_back((Expression*)operandExpr);
  return index;
}